

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void nivalis::util::ltrim(string *s)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pcVar1 = pcVar2 + uVar3;
  pcVar6 = pcVar2;
  if (0 < (long)uVar3 >> 2) {
    pcVar6 = pcVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar3 >> 2) + 1;
    pcVar7 = pcVar2 + 3;
    do {
      iVar4 = isspace((int)pcVar7[-3]);
      if (iVar4 == 0) {
        pcVar7 = pcVar7 + -3;
        goto LAB_0010ffdb;
      }
      iVar4 = isspace((int)pcVar7[-2]);
      if (iVar4 == 0) {
        pcVar7 = pcVar7 + -2;
        goto LAB_0010ffdb;
      }
      iVar4 = isspace((int)pcVar7[-1]);
      if (iVar4 == 0) {
        pcVar7 = pcVar7 + -1;
        goto LAB_0010ffdb;
      }
      iVar4 = isspace((int)*pcVar7);
      if (iVar4 == 0) goto LAB_0010ffdb;
      lVar5 = lVar5 + -1;
      pcVar7 = pcVar7 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pcVar1 - (long)pcVar6;
  if (lVar5 == 1) {
LAB_0010ffb7:
    iVar4 = isspace((int)*pcVar6);
    pcVar7 = pcVar6;
    if (iVar4 != 0) {
      pcVar7 = pcVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_0010ffa6:
    iVar4 = isspace((int)*pcVar6);
    pcVar7 = pcVar6;
    if (iVar4 != 0) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0010ffb7;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_0010fffe;
    iVar4 = isspace((int)*pcVar6);
    pcVar7 = pcVar6;
    if (iVar4 != 0) {
      pcVar6 = pcVar6 + 1;
      goto LAB_0010ffa6;
    }
  }
LAB_0010ffdb:
  if (pcVar1 != pcVar7) {
    std::__cxx11::string::_M_erase((ulong)s,0);
    return;
  }
LAB_0010fffe:
  s->_M_string_length = 0;
  *pcVar2 = '\0';
  return;
}

Assistant:

void ltrim(std::string& s) {
    s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](int ch) {
        return !::std::isspace(ch);
    }));
}